

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O1

Expected<llvm::DWARFDebugNames::Entry> * __thiscall
llvm::DWARFDebugNames::NameIndex::getEntry
          (Expected<llvm::DWARFDebugNames::Entry> *__return_storage_ptr__,NameIndex *this,
          uint64_t *Offset)

{
  Expected<llvm::DWARFDebugNames::Entry> *pEVar1;
  bool bVar2;
  uint64_t uVar3;
  char *pcVar4;
  undefined8 *puVar5;
  DWARFFormValue *this_00;
  long lVar6;
  DWARFDataExtractor *Data;
  const_iterator cVar7;
  error_code EC;
  error_code EC_00;
  error_code EC_01;
  undefined1 local_118 [8];
  Entry E;
  Error local_58;
  Error local_50;
  uint local_48;
  FormParams local_44;
  uint32_t AbbrevCode;
  Expected<llvm::DWARFDebugNames::Entry> *local_38;
  
  local_38 = __return_storage_ptr__;
  if (*Offset < (this->Section->super_DWARFAcceleratorTable).AccelSection.super_DataExtractor.Data.
                Length) {
    Data = &(this->Section->super_DWARFAcceleratorTable).AccelSection;
    uVar3 = DataExtractor::getULEB128(&Data->super_DataExtractor,Offset,(Error *)0x0);
    local_48 = (uint)uVar3;
    if (local_48 == 0) {
      puVar5 = (undefined8 *)operator_new(8);
      *puVar5 = &PTR__ErrorInfoBase_01097ee0;
      local_58.Payload = (ErrorInfoBase *)((ulong)puVar5 | 1);
      Expected<llvm::DWARFDebugNames::Entry>::Expected(local_38,&local_58);
      local_50.Payload = local_58.Payload;
    }
    else {
      cVar7 = DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
              ::find_as<unsigned_int>
                        ((DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
                          *)this,&local_48);
      if (&(cVar7.Ptr)->key !=
          &(this->Abbrevs).
           super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
           .TheMap.Buckets
           [(this->Abbrevs).
            super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
            .TheMap.NumBuckets].key) {
        DWARFDebugNames::Entry::Entry((Entry *)local_118,this,&(cVar7.Ptr)->key);
        if ((ulong)(uint)E.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
                         super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
                         super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.
                         super_SmallVectorBase.BeginX != 0) {
          local_44.AddrSize = '\0';
          local_44.Format = DWARF32;
          local_44.Version = (this->Hdr).super_HeaderPOD.Version;
          lVar6 = (ulong)(uint)E.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
                               super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
                               super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.
                               super_SmallVectorBase.BeginX * 0x30;
          this_00 = (DWARFFormValue *)E.super_Entry._vptr_Entry;
          do {
            bVar2 = DWARFFormValue::extractValue
                              (this_00,Data,Offset,local_44,(DWARFContext *)0x0,(DWARFUnit *)0x0);
            if (!bVar2) {
              pcVar4 = (char *)std::_V2::generic_category();
              EC._M_cat = (error_category *)0x5;
              EC._0_8_ = &AbbrevCode;
              createStringError(EC,pcVar4);
              Expected<llvm::DWARFDebugNames::Entry>::Expected(local_38,(Error *)&AbbrevCode);
              if ((long *)((ulong)_AbbrevCode & 0xfffffffffffffffe) != (long *)0x0) {
                (**(code **)(*(long *)((ulong)_AbbrevCode & 0xfffffffffffffffe) + 8))();
              }
              if (!bVar2) goto LAB_00d62137;
            }
            this_00 = this_00 + 1;
            lVar6 = lVar6 + -0x30;
          } while (lVar6 != 0);
        }
        pEVar1 = local_38;
        local_38->field_0xb8 = local_38->field_0xb8 & 0xfe;
        *(undefined ***)(local_38->field_0).ErrorStorage.buffer = &PTR___cxa_pure_virtual_01097f30;
        SmallVector<llvm::DWARFFormValue,_3U>::SmallVector
                  ((SmallVector<llvm::DWARFFormValue,_3U> *)((long)&local_38->field_0 + 8),
                   (SmallVector<llvm::DWARFFormValue,_3U> *)&E);
        *(undefined ***)(pEVar1->field_0).ErrorStorage.buffer = &PTR_getCUOffset_01097e30;
        *(undefined8 *)((long)&pEVar1->field_0 + 0xa8) =
             E.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.InlineElts[2].
             buffer._40_8_;
        *(NameIndex **)((long)&pEVar1->field_0 + 0xb0) = E.NameIdx;
LAB_00d62137:
        local_118 = (undefined1  [8])&PTR___cxa_pure_virtual_01097f30;
        if (E.super_Entry._vptr_Entry ==
            (_func_int **)
            ((long)&E.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
                    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
                    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.
                    super_SmallVectorBase + 8U)) {
          return local_38;
        }
        free(E.super_Entry._vptr_Entry);
        return local_38;
      }
      pcVar4 = (char *)std::_V2::generic_category();
      EC_01._M_cat = (error_category *)0x16;
      EC_01._0_8_ = &local_50;
      createStringError(EC_01,pcVar4);
      Expected<llvm::DWARFDebugNames::Entry>::Expected(local_38,&local_50);
    }
  }
  else {
    pcVar4 = (char *)std::_V2::generic_category();
    EC_00._M_cat = (error_category *)0x54;
    EC_00._0_8_ = &E.Abbr;
    createStringError(EC_00,pcVar4);
    Expected<llvm::DWARFDebugNames::Entry>::Expected(__return_storage_ptr__,(Error *)&E.Abbr);
    local_50.Payload = (ErrorInfoBase *)E.Abbr;
  }
  if ((long *)((ulong)local_50.Payload & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)((ulong)local_50.Payload & 0xfffffffffffffffe) + 8))();
  }
  return local_38;
}

Assistant:

Expected<DWARFDebugNames::Entry>
DWARFDebugNames::NameIndex::getEntry(uint64_t *Offset) const {
  const DWARFDataExtractor &AS = Section.AccelSection;
  if (!AS.isValidOffset(*Offset))
    return createStringError(errc::illegal_byte_sequence,
                             "Incorrectly terminated entry list.");

  uint32_t AbbrevCode = AS.getULEB128(Offset);
  if (AbbrevCode == 0)
    return make_error<SentinelError>();

  const auto AbbrevIt = Abbrevs.find_as(AbbrevCode);
  if (AbbrevIt == Abbrevs.end())
    return createStringError(errc::invalid_argument, "Invalid abbreviation.");

  Entry E(*this, *AbbrevIt);

  dwarf::FormParams FormParams = {Hdr.Version, 0, dwarf::DwarfFormat::DWARF32};
  for (auto &Value : E.Values) {
    if (!Value.extractValue(AS, Offset, FormParams))
      return createStringError(errc::io_error,
                               "Error extracting index attribute values.");
  }
  return std::move(E);
}